

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O3

void __thiscall
QTextBoundaryFinder::QTextBoundaryFinder(QTextBoundaryFinder *this,QTextBoundaryFinder *other)

{
  Data *pDVar1;
  storage_type_conflict *psVar2;
  QCharAttributes *__dest;
  size_t __size;
  
  this->t = other->t;
  pDVar1 = (other->s).d.d;
  (this->s).d.d = pDVar1;
  (this->s).d.ptr = (other->s).d.ptr;
  (this->s).d.size = (other->s).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  psVar2 = (other->sv).m_data;
  (this->sv).m_size = (other->sv).m_size;
  (this->sv).m_data = psVar2;
  this->pos = other->pos;
  this->field_0x38 = this->field_0x38 | 1;
  this->attributes = (QCharAttributes *)0x0;
  if (other->attributes != (QCharAttributes *)0x0) {
    __size = (this->sv).m_size + 1;
    __dest = (QCharAttributes *)malloc(__size);
    this->attributes = __dest;
    if (__dest != (QCharAttributes *)0x0) {
      memcpy(__dest,other->attributes,__size);
      return;
    }
    qBadAlloc();
  }
  return;
}

Assistant:

QTextBoundaryFinder::QTextBoundaryFinder(const QTextBoundaryFinder &other)
    : t(other.t)
    , s(other.s)
    , sv(other.sv)
    , pos(other.pos)
    , freeBuffer(true)
{
    if (other.attributes) {
        Q_ASSERT(sv.size() > 0);
        attributes = (QCharAttributes *) malloc((sv.size() + 1) * sizeof(QCharAttributes));
        Q_CHECK_PTR(attributes);
        memcpy(attributes, other.attributes, (sv.size() + 1) * sizeof(QCharAttributes));
    }
}